

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O0

int run_test_pipe_set_non_blocking(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_file local_1160;
  int n;
  int fd [2];
  uv_buf_t buf;
  char data [4096];
  size_t nwritten;
  uv_thread_t thread;
  uv_pipe_t pipe_handle;
  thread_ctx ctx;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&thread,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x40,"0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0)");
    abort();
  }
  iVar1 = socketpair(1,1,0,&local_1160);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x41,"0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd)");
    abort();
  }
  iVar1 = uv_pipe_open((uv_pipe_t *)&thread,local_1160);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x42,"0 == uv_pipe_open(&pipe_handle, fd[0])");
    abort();
  }
  iVar1 = uv_stream_set_blocking((uv_stream_t *)&thread,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x43,"0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1)");
    abort();
  }
  iVar1 = uv_barrier_init((uv_barrier_t *)&pipe_handle.pipe_fname,2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x46,"0 == uv_barrier_init(&ctx.barrier, 2)");
    abort();
  }
  iVar1 = uv_thread_create(&nwritten,thread_main,&pipe_handle.pipe_fname);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x47,"0 == uv_thread_create(&thread, thread_main, &ctx)");
    abort();
  }
  uv_barrier_wait((uv_barrier_t *)&pipe_handle.pipe_fname);
  buf.base = (char *)0x1000;
  fd = (int  [2])&buf.len;
  memset(&buf.len,0x2e,0x1000);
  data[0xff8] = '\0';
  data[0xff9] = '\0';
  data[0xffa] = '\0';
  data[0xffb] = '\0';
  data[0xffc] = '\0';
  data[0xffd] = '\0';
  data[0xffe] = '\0';
  data[0xfff] = '\0';
  for (; (ulong)data._4088_8_ < 0xa00000; data._4088_8_ = data._4088_8_ + 0x1000) {
    iVar1 = uv_try_write((uv_stream_t *)&thread,(uv_buf_t *)fd,1);
    if (iVar1 != 0x1000) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
              ,0x54,"n == sizeof(data)");
      abort();
    }
  }
  uv_close((uv_handle_t *)&thread,(uv_close_cb)0x0);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x59,"0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_thread_join(&nwritten);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x5b,"0 == uv_thread_join(&thread)");
    abort();
  }
  iVar1 = close(n);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x5c,"0 == close(fd[1])");
    abort();
  }
  uv_barrier_destroy((uv_barrier_t *)&pipe_handle.pipe_fname);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
            ,0x5f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  int fd[2];
  int n;

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd));
  ASSERT(0 == uv_pipe_open(&pipe_handle, fd[0]));
  ASSERT(0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));

  ctx.fd = fd[1];
  ASSERT(0 == uv_barrier_init(&ctx.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < 10 << 20) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
    ASSERT(n == sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == close(fd[1]));  /* fd[0] is closed by uv_close(). */
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY();
  return 0;
}